

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

StringTree * capnp::compiler::tupleLiteral(Reader params)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  Branch *pBVar4;
  StringTree *pSVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StringTree *in_RDI;
  Branch *pBVar6;
  Branch *pBVar7;
  Branch *pBVar8;
  ElementCount index;
  Branch *pBVar9;
  ulong capacity;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  Reader RVar14;
  StringPtr delim;
  uint in_stack_00000020;
  StructReader in_stack_00000030;
  Array<kj::StringTree> result;
  ArrayBuilder<kj::StringTree> parts;
  Reader param;
  SegmentReader *pSVar15;
  CapTableReader *pCVar16;
  void *pvVar17;
  WirePointer *pWVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  StringTree local_1a0;
  StringTree local_168;
  Branch *local_130;
  StringTree local_128;
  undefined8 *local_f0;
  StringTree *local_e0;
  StructReader local_d8;
  ArrayPtr<const_char> local_a8;
  StructReader local_98;
  StructReader local_60;
  
  capacity = (ulong)in_stack_00000020;
  pBVar9 = (Branch *)0x0;
  pBVar6 = (Branch *)0x0;
  local_e0 = in_RDI;
  pBVar4 = (Branch *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x38,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_128.branches.disposer = (ArrayDisposer *)(&pBVar4->index + capacity * 7);
  local_f0 = &kj::_::HeapArrayDisposer::instance;
  local_130 = pBVar4;
  if (capacity != 0) {
    index = 0;
    local_128.branches.ptr = pBVar4;
    do {
      local_128.branches.size_ = (size_t)pBVar4;
      capnp::_::ListReader::getStructElement(&local_d8,(ListReader *)&stack0x00000008,index);
      local_168.text.content.size_ = (size_t)((long)local_d8.pointers + 8);
      if (local_d8.pointerCount < 2) {
        local_168.text.content.size_ = (size_t)pBVar9;
      }
      uVar10 = local_d8.segment._0_4_;
      uVar11 = local_d8.segment._4_4_;
      uVar12 = local_d8.capTable._0_4_;
      uVar13 = local_d8.capTable._4_4_;
      local_168.text.content.disposer._0_4_ = local_d8.nestingLimit;
      if (local_d8.pointerCount < 2) {
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        local_168.text.content.disposer._0_4_ = 0x7fffffff;
      }
      local_168.size_ = CONCAT44(uVar11,uVar10);
      local_168.text.content.ptr = (char *)CONCAT44(uVar13,uVar12);
      capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)&local_168,(word *)0x0);
      pSVar15 = local_60.segment;
      pCVar16 = local_60.capTable;
      pvVar17 = local_60.data;
      pWVar18 = local_60.pointers;
      uVar19 = local_60._32_8_;
      uVar20 = local_60._40_8_;
      expressionStringTree((Reader)in_stack_00000030);
      if ((0xf < local_d8.dataSize) && (*local_d8.data == 1)) {
        local_128.text.content.disposer._0_4_ = local_d8.nestingLimit;
        local_128.text.content.size_ = (size_t)local_d8.pointers;
        if (local_d8.pointerCount == 0) {
          local_128.text.content.disposer._0_4_ = 0x7fffffff;
          local_128.text.content.size_ = (size_t)pBVar9;
        }
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        if (local_d8.pointerCount != 0) {
          uVar10 = local_d8.segment._0_4_;
          uVar11 = local_d8.segment._4_4_;
          uVar12 = local_d8.capTable._0_4_;
          uVar13 = local_d8.capTable._4_4_;
        }
        local_128.size_ = CONCAT44(uVar11,uVar10);
        local_128.text.content.ptr = (char *)CONCAT44(uVar13,uVar12);
        capnp::_::PointerReader::getStruct(&local_98,(PointerReader *)&local_128,(word *)0x0);
        local_128.text.content.disposer._0_4_ = local_98.nestingLimit;
        local_128.text.content.size_ = (size_t)local_98.pointers;
        if (local_98.pointerCount == 0) {
          local_128.text.content.disposer._0_4_ = 0x7fffffff;
          local_128.text.content.size_ = (size_t)pBVar9;
        }
        uVar10 = 0;
        uVar11 = 0;
        uVar12 = 0;
        uVar13 = 0;
        if (local_98.pointerCount != 0) {
          uVar10 = local_98.segment._0_4_;
          uVar11 = local_98.segment._4_4_;
          uVar12 = local_98.capTable._0_4_;
          uVar13 = local_98.capTable._4_4_;
        }
        local_128.size_ = CONCAT44(uVar11,uVar10);
        local_128.text.content.ptr = (char *)CONCAT44(uVar13,uVar12);
        RVar14 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)&local_128,(void *)0x0,0);
        local_128.size_ = RVar14.super_StringPtr.content.ptr;
        local_128.text.content.ptr = (char *)(RVar14.super_StringPtr.content.size_ - 1);
        local_a8.ptr = " = ";
        local_a8.size_ = 3;
        kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
                  (&local_168,&local_128,&local_a8,(ArrayPtr<const_char> *)&local_1a0,
                   (StringTree *)pBVar6);
        pBVar7 = (Branch *)local_1a0.text.content.size_;
        pcVar1 = local_1a0.text.content.ptr;
        local_1a0.size_ = local_168.size_;
        if (local_1a0.text.content.ptr != (char *)0x0) {
          local_1a0.text.content.ptr = (char *)0x0;
          local_1a0.text.content.size_ = 0;
          (**(local_1a0.text.content.disposer)->_vptr_ArrayDisposer)
                    (local_1a0.text.content.disposer,pcVar1,1,pBVar7,pBVar7,0,pSVar15,pCVar16,
                     pvVar17,pWVar18,uVar19,uVar20);
          pBVar6 = pBVar7;
        }
        pBVar8 = (Branch *)local_1a0.branches.size_;
        pBVar7 = local_1a0.branches.ptr;
        local_1a0.text.content.ptr = local_168.text.content.ptr;
        local_1a0.text.content.disposer =
             (ArrayDisposer *)
             CONCAT44(local_168.text.content.disposer._4_4_,(int)local_168.text.content.disposer);
        local_1a0.text.content.size_ = local_168.text.content.size_;
        local_168.text.content.ptr = (char *)0x0;
        local_168.text.content.size_ = 0;
        if (local_1a0.branches.ptr != (Branch *)0x0) {
          local_1a0.branches.ptr = (Branch *)0x0;
          local_1a0.branches.size_ = 0;
          (**(local_1a0.branches.disposer)->_vptr_ArrayDisposer)
                    (local_1a0.branches.disposer,pBVar7,0x40);
          pBVar6 = pBVar8;
        }
        pBVar7 = (Branch *)local_168.text.content.size_;
        pcVar1 = local_168.text.content.ptr;
        local_1a0.branches.ptr = local_168.branches.ptr;
        local_1a0.branches.size_ = local_168.branches.size_;
        local_1a0.branches.disposer = local_168.branches.disposer;
        local_168.branches.ptr = (Branch *)0x0;
        local_168.branches.size_ = 0;
        if (local_168.text.content.ptr != (char *)0x0) {
          local_168.text.content.ptr = (char *)0x0;
          local_168.text.content.size_ = 0;
          (*(code *)**(undefined8 **)
                      CONCAT44(local_168.text.content.disposer._4_4_,
                               (int)local_168.text.content.disposer))
                    ((undefined8 *)
                     CONCAT44(local_168.text.content.disposer._4_4_,
                              (int)local_168.text.content.disposer),pcVar1,1);
          pBVar6 = pBVar7;
        }
      }
      pBVar4->index = local_1a0.size_;
      (pBVar4->content).size_ = (size_t)local_1a0.text.content.ptr;
      (pBVar4->content).text.content.ptr = (char *)local_1a0.text.content.size_;
      local_1a0.text.content.ptr = (char *)0x0;
      local_1a0.text.content.size_ = 0;
      (pBVar4->content).text.content.size_ = (size_t)local_1a0.text.content.disposer;
      (pBVar4->content).text.content.disposer = (ArrayDisposer *)local_1a0.branches.ptr;
      (pBVar4->content).branches.ptr = (Branch *)local_1a0.branches.size_;
      (pBVar4->content).branches.size_ = (size_t)local_1a0.branches.disposer;
      pBVar4 = (Branch *)&(pBVar4->content).branches.disposer;
      index = index + 1;
    } while (in_stack_00000020 != index);
  }
  local_168.text.content.ptr = (char *)(((long)pBVar4 - (long)local_130 >> 3) * 0x6db6db6db6db6db7);
  local_168.size_ = (size_t)local_130;
  local_168.text.content.size_ = (size_t)&kj::_::HeapArrayDisposer::instance;
  local_128.branches.ptr = (Branch *)0x0;
  local_128.branches.size_ = 0;
  local_128.branches.disposer = (ArrayDisposer *)0x0;
  delim.content.size_ = 3;
  delim.content.ptr = ", ";
  kj::StringTree::StringTree(&local_1a0,(Array<kj::StringTree> *)&local_168,delim);
  pSVar5 = kj::strTree<char_const(&)[3],kj::StringTree,char_const(&)[3]>
                     (local_e0,(kj *)"( ",(char (*) [3])&local_1a0,(StringTree *)0x4d3f6f,
                      (char (*) [3])pBVar6);
  sVar2 = local_1a0.branches.size_;
  pBVar6 = local_1a0.branches.ptr;
  if (local_1a0.branches.ptr != (Branch *)0x0) {
    local_1a0.branches.ptr = (Branch *)0x0;
    local_1a0.branches.size_ = 0;
    iVar3 = (**(local_1a0.branches.disposer)->_vptr_ArrayDisposer)
                      (local_1a0.branches.disposer,pBVar6,0x40,sVar2,sVar2,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
    pSVar5 = (StringTree *)CONCAT44(extraout_var,iVar3);
  }
  sVar2 = local_1a0.text.content.size_;
  pcVar1 = local_1a0.text.content.ptr;
  if (local_1a0.text.content.ptr != (char *)0x0) {
    local_1a0.text.content.ptr = (char *)0x0;
    local_1a0.text.content.size_ = 0;
    iVar3 = (**(local_1a0.text.content.disposer)->_vptr_ArrayDisposer)
                      (local_1a0.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
    pSVar5 = (StringTree *)CONCAT44(extraout_var_00,iVar3);
  }
  pcVar1 = local_168.text.content.ptr;
  sVar2 = local_168.size_;
  if ((Branch *)local_168.size_ != (Branch *)0x0) {
    local_168.size_ = 0;
    local_168.text.content.ptr = (char *)0x0;
    pSVar5 = (StringTree *)
             (*(code *)**(undefined8 **)local_168.text.content.size_)
                       (local_168.text.content.size_,sVar2,0x38,pcVar1,pcVar1,
                        kj::ArrayDisposer::Dispose_<kj::StringTree,_false>::destruct);
  }
  return pSVar5;
}

Assistant:

static kj::StringTree tupleLiteral(List<Expression::Param>::Reader params) {
  auto parts = kj::heapArrayBuilder<kj::StringTree>(params.size());
  for (auto param: params) {
    auto part = expressionStringTree(param.getValue());
    if (param.isNamed()) {
      part = kj::strTree(param.getNamed().getValue(), " = ", kj::mv(part));
    }
    parts.add(kj::mv(part));
  }
  return kj::strTree("( ", kj::StringTree(parts.finish(), ", "), " )");
}